

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::previousCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  int32_t *piVar1;
  int32_t *piVar2;
  uint8_t uVar3;
  byte bVar4;
  int32_t iVar5;
  uint8_t *puVar6;
  UBool UVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  State SVar11;
  UChar32 UVar12;
  long lVar13;
  
  piVar1 = &(this->super_UTF8CollationIterator).pos;
  do {
    while (SVar11 = this->state, SVar11 == IN_FCD_SEGMENT) {
      iVar10 = (this->super_UTF8CollationIterator).pos;
      SVar11 = CHECK_BWD;
      if (iVar10 != this->start) {
        puVar6 = (this->super_UTF8CollationIterator).u8;
        (this->super_UTF8CollationIterator).pos = iVar10 + -1;
        bVar4 = puVar6[(long)iVar10 + -1];
        if (-1 < (char)bVar4) {
          return (uint)bVar4;
        }
        UVar12 = utf8_prevCharSafeBody_63(puVar6,0,piVar1,(uint)bVar4,-3);
        return UVar12;
      }
LAB_002212db:
      this->state = SVar11;
    }
    if (SVar11 != CHECK_BWD) {
      iVar10 = *piVar1;
      if (iVar10 != 0 && 2 < (int)SVar11) {
        uVar8 = UnicodeString::char32At(&this->normalized,iVar10 + -1);
        piVar1 = &(this->super_UTF8CollationIterator).pos;
        *piVar1 = *piVar1 + (uVar8 < 0x10000 | 0xfffffffe);
        return uVar8;
      }
      if (SVar11 == CHECK_FWD) {
        this->limit = iVar10;
        SVar11 = (iVar10 != this->start) + CHECK_BWD;
      }
      else {
        iVar5 = this->start;
        (this->super_UTF8CollationIterator).pos = iVar5;
        this->limit = iVar5;
        SVar11 = CHECK_BWD;
      }
      goto LAB_002212db;
    }
    iVar10 = *piVar1;
    lVar13 = (long)iVar10;
    if (lVar13 == 0) {
      return -1;
    }
    puVar6 = (this->super_UTF8CollationIterator).u8;
    uVar3 = puVar6[lVar13 + -1];
    if (-1 < (char)uVar3) {
      *piVar1 = iVar10 + -1;
      return (int)(char)uVar3;
    }
    *piVar1 = iVar10 + -1;
    uVar8 = (uint)puVar6[lVar13 + -1];
    if ((char)puVar6[lVar13 + -1] < '\0') {
      uVar8 = utf8_prevCharSafeBody_63(puVar6,0,piVar1,uVar8,-3);
    }
    uVar9 = (uVar8 >> 10) + 0xd7c0 & 0xffff;
    if ((int)uVar8 < 0x10000) {
      uVar9 = uVar8;
    }
    if ((int)uVar9 < 0x300) {
      return uVar8;
    }
    if ((ulong)(byte)CollationFCD::lcccIndex[uVar9 >> 5] == 0) {
      return uVar8;
    }
    if ((*(uint *)(CollationFCD::lcccBits + (ulong)(byte)CollationFCD::lcccIndex[uVar9 >> 5] * 4) >>
         (uVar9 & 0x1f) & 1) == 0) {
      return uVar8;
    }
    if ((uVar8 & 0x1fff01) == 0xf01) {
LAB_002211ec:
      iVar10 = 3;
      if ((0xd7ff < uVar8) && (iVar10 = 0, 0xffefdfff < uVar8 - 0x110000)) {
        iVar10 = 4 - (uint)(uVar8 < 0x10000);
      }
    }
    else {
      if (*piVar1 == 0) {
        return uVar8;
      }
      UVar7 = previousHasTccc(this);
      if (UVar7 == '\0') {
        return uVar8;
      }
      iVar10 = 1;
      if ((0x7f < uVar8) && (iVar10 = 2, 0x7ff < uVar8)) goto LAB_002211ec;
    }
    piVar2 = &(this->super_UTF8CollationIterator).pos;
    *piVar2 = *piVar2 + iVar10;
    UVar7 = previousSegment(this,errorCode);
    if (UVar7 == '\0') {
      return -1;
    }
  } while( true );
}

Assistant:

UChar32
FCDUTF8CollationIterator::previousCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_BWD) {
            if(pos == 0) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c = u8[pos - 1])) {
                --pos;
                return c;
            }
            U8_PREV_OR_FFFD(u8, 0, pos, c);
            if(CollationFCD::hasLccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != 0 && previousHasTccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos += U8_LENGTH(c);
                if(!previousSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != start) {
            U8_PREV_OR_FFFD(u8, 0, pos, c);
            return c;
        } else if(state >= IN_NORMALIZED && pos != 0) {
            c = normalized.char32At(pos - 1);
            pos -= U16_LENGTH(c);
            return c;
        } else {
            switchToBackward();
        }
    }
}